

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsparser.cc
# Opt level: O0

int ctemplate_htmlparser::js_is_whitespace(char c)

{
  undefined1 local_a;
  char c_local;
  
  local_a = true;
  if ((((c != '\t') && (local_a = true, c != '\v')) && (local_a = true, c != '\f')) &&
     (((local_a = true, c != ' ' && (local_a = true, c != -0x60)) && (local_a = true, c != '\n'))))
  {
    local_a = c == '\r';
  }
  return (int)local_a;
}

Assistant:

static inline int js_is_whitespace(char c)
{
  return c == '\t' ||   /* Tab 0x09 */
         c == '\v' ||   /* Vertical Tab 0x0B */
         c == '\f' ||   /* Form Feed 0x0C */
         c == ' ' ||    /* Space 0x20 */
         c == '\xa0' || /* No-Break Space 0xA0 */
         c == '\n' ||   /* line Feed 0x0A */
         c == '\r';     /* Carriage Return 0x0D */
}